

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O1

void __thiscall itis::AVLTree<int>::insert(AVLTree<int> *this,int value)

{
  AVLTreeNode<int> *this_00;
  AVLTreeNode<int> **indirect;
  vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_> path;
  AVLTreeNode<int> **local_60;
  vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_> local_58;
  vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_> local_38;
  
  local_60 = &this->root;
  local_58.super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish = (AVLTreeNode<int> ***)0x0;
  local_58.super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (AVLTreeNode<int> ***)0x0;
  if (this->root != (AVLTreeNode<int> *)0x0) {
    do {
      if (local_58.
          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>>::
        _M_realloc_insert<itis::AVLTreeNode<int>**const&>
                  ((vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>> *)
                   &local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_58.
         super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_60;
        local_58.
        super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_60 = &(*local_60)->right + (value < (*local_60)->value);
    } while (*local_60 != (AVLTreeNode<int> *)0x0);
  }
  this_00 = (AVLTreeNode<int> *)operator_new(0x20);
  AVLTreeNode<int>::AVLTreeNode(this_00,value);
  *local_60 = this_00;
  if (local_58.
      super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>>::
    _M_realloc_insert<itis::AVLTreeNode<int>**const&>
              ((vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>> *)
               &local_58,
               (iterator)
               local_58.
               super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_60);
  }
  else {
    *local_58.
     super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_60;
    local_58.
    super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  std::vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>::vector
            (&local_38,&local_58);
  balance(this,&local_38);
  if (local_38.
      super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->_size = this->_size + 1;
  if (local_58.
      super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AVLTree<T>::insert(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    *indirect = new AVLTreeNode<T>(value);
    path.push_back(indirect);

    balance(path);
    _size++;
  }